

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O0

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
::removeColRange(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                 *this,int start,int end,int *perm)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  long in_RCX;
  int in_EDX;
  int in_ESI;
  long *in_RDI;
  int i;
  DataArray<int> p;
  int i_1;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined8 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int local_48;
  DataArray<int> local_38;
  int local_1c;
  long local_18;
  int local_10;
  int local_c;
  
  if (in_RCX == 0) {
    local_1c = (in_EDX - in_ESI) + 1;
    local_10 = in_EDX;
    local_c = in_ESI;
    DataArray<int>::DataArray
              ((DataArray<int> *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),(int)in_stack_ffffffffffffff98,
               (Real)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    while (local_1c = local_1c + -1, -1 < local_1c) {
      iVar1 = local_c + local_1c;
      piVar3 = DataArray<int>::operator[](&local_38,local_1c);
      *piVar3 = iVar1;
    }
    piVar3 = DataArray<int>::get_ptr(&local_38);
    (**(code **)(*in_RDI + 200))(in_RDI,piVar3,(local_10 - local_c) + 1,0);
    DataArray<int>::~DataArray
              ((DataArray<int> *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  }
  else {
    for (local_48 = 0; local_48 < in_ESI; local_48 = local_48 + 1) {
      *(int *)(in_RCX + (long)local_48 * 4) = local_48;
    }
    for (; local_18 = in_RCX, local_48 <= in_EDX; local_48 = local_48 + 1) {
      *(undefined4 *)(in_RCX + (long)local_48 * 4) = 0xffffffff;
    }
    while (iVar1 = local_48,
          iVar2 = nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                         *)0x17d300), iVar1 < iVar2) {
      *(int *)(local_18 + (long)local_48 * 4) = local_48;
      local_48 = local_48 + 1;
    }
    (**(code **)(*in_RDI + 0xb8))(in_RDI,local_18);
  }
  return;
}

Assistant:

virtual void removeColRange(int start, int end, int perm[] = nullptr)
   {

      if(perm == nullptr)
      {
         int i = end - start + 1;
         DataArray < int > p(i);

         while(--i >= 0)
            p[i] = start + i;

         removeCols(p.get_ptr(), end - start + 1);
         return;
      }

      int i;

      for(i = 0; i < start; ++i)
         perm[i] = i;

      for(; i <= end; ++i)
         perm[i] = -1;

      for(; i < nCols(); ++i)
         perm[i] = i;

      removeCols(perm);
   }